

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86_avx512::forward
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  int *piVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined4 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  __m512 v_03;
  __m512 v_04;
  __m512 v_05;
  __m512 v_06;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  sbyte sVar44;
  int unaff_EBP;
  int iVar45;
  float *outptr;
  undefined1 (*pauVar46) [64];
  undefined1 (*pauVar47) [32];
  undefined1 (*pauVar48) [16];
  ulong uVar49;
  char cVar50;
  size_t sVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 (*pauVar57) [64];
  undefined1 (*pauVar58) [32];
  undefined1 (*pauVar59) [16];
  size_t sVar60;
  int iVar61;
  ulong uVar62;
  ulong uVar63;
  undefined1 (*pauVar64) [64];
  undefined1 (*pauVar65) [32];
  undefined1 (*pauVar66) [16];
  int iVar67;
  long lVar68;
  ulong uVar69;
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined8 in_XMM1_Qa;
  undefined8 uVar75;
  __m128 v_07;
  __m128 v_08;
  __m128 v_09;
  __m128 v_10;
  undefined4 in_stack_fffffffffffffe88;
  Padding_x86_avx512 *pPVar76;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  float fVar77;
  Mat m_1;
  Mat m;
  undefined4 uVar14;
  undefined3 uVar16;
  undefined2 uVar18;
  undefined4 uVar22;
  undefined3 uVar24;
  undefined2 uVar26;
  undefined3 uVar30;
  undefined2 uVar32;
  
  p_Var6 = this->_vptr_Padding_x86_avx512[-3];
  if (((((*(int *)(&this->field_0xd0 + (long)p_Var6) == 0) &&
        (*(int *)(&this->field_0xd4 + (long)p_Var6) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var6) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var6) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var6) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var6) == 0)) {
    iVar38 = 0;
    if (top_blob != bottom_blob) {
      piVar8 = bottom_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = top_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar8 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar8;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar3 = bottom_blob->w;
      iVar4 = bottom_blob->h;
      iVar5 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar3;
      top_blob->h = iVar4;
      top_blob->d = iVar5;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar38 = bottom_blob->elempack;
    if ((iVar38 != 0) && (((int)bottom_blob->elemsize << 3) / iVar38 == 8)) {
      iVar38 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar38;
    }
    iVar3 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    iVar5 = bottom_blob->d;
    uVar42 = bottom_blob->c;
    uVar43 = (ulong)uVar42;
    iVar67 = bottom_blob->dims;
    uVar49 = bottom_blob->elemsize;
    pPVar76 = this;
    if (iVar38 == 0x10) {
      if (iVar67 == 1) {
        uVar39 = iVar3 * 0x10 + *(uint *)(&this->field_0xd8 + (long)p_Var6) +
                 *(int *)(&this->field_0xdc + (long)p_Var6);
        if ((uVar39 & 0xf) == 0) {
          cVar50 = '\x10';
        }
        else if ((uVar39 & 7) == 0) {
          cVar50 = '\b';
        }
        else {
          cVar50 = ((uVar39 & 3) == 0) * '\x03' + '\x01';
        }
        bVar9 = true;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var6) & 0xf) == 0) && (cVar50 == '\x10')) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          uVar41 = uVar39 + 0xf;
          if (-1 < (int)uVar39) {
            uVar41 = uVar39;
          }
          Mat::create(top_blob,(int)uVar41 >> 4,uVar49 & 0xfffffffffffffff0,0x10,opt->blob_allocator
                     );
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var6 = this->_vptr_Padding_x86_avx512[-3];
              vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var6)));
              iVar52 = *(int *)(&this->field_0xd8 + (long)p_Var6);
              iVar55 = *(int *)(&this->field_0xdc + (long)p_Var6);
              iVar61 = iVar52 + 0xf;
              if (-1 < iVar52) {
                iVar61 = iVar52;
              }
              iVar52 = iVar55 + 0xf;
              if (-1 < iVar55) {
                iVar52 = iVar55;
              }
              v_03[1] = (float)iVar38;
              v_03[0] = (float)in_stack_fffffffffffffe88;
              v_03._8_8_ = this;
              v_03[4] = (float)in_stack_fffffffffffffe98;
              v_03[5] = (float)iVar67;
              v_03[6] = (float)in_stack_fffffffffffffea0;
              v_03[7] = in_stack_fffffffffffffea4;
              v_03._32_8_ = m_1.data;
              v_03[10] = (float)m_1.refcount._0_4_;
              v_03[0xb] = (float)m_1.refcount._4_4_;
              v_03[0xc] = (float)(undefined4)m_1.elemsize;
              v_03[0xd] = (float)m_1.elemsize._4_4_;
              v_03[0xe] = (float)m_1.elempack;
              v_03[0xf] = (float)m_1._28_4_;
              padding_constant_pack16_avx512(bottom_blob,top_blob,0,0,iVar61 >> 4,iVar52 >> 4,v_03);
              unaff_EBP = 0;
              bVar9 = false;
            }
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      pPVar76 = this;
      if (iVar67 == 2) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = iVar4 * 0x10 + *(uint *)(&this->field_0xd0 + (long)p_Var6) +
                 *(int *)(&this->field_0xd4 + (long)p_Var6);
        if ((uVar39 & 0xf) == 0) {
          cVar50 = '\x10';
        }
        else if ((uVar39 & 7) == 0) {
          cVar50 = '\b';
        }
        else {
          cVar50 = ((uVar39 & 3) == 0) * '\x03' + '\x01';
        }
        bVar9 = true;
        if ((((*(uint *)(&this->field_0xd0 + (long)p_Var6) & 0xf) == 0) && (cVar50 == '\x10')) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          uVar41 = uVar39 + 0xf;
          if (-1 < (int)uVar39) {
            uVar41 = uVar39;
          }
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var6) + iVar3 +
                               *(int *)(&this->field_0xdc + (long)p_Var6),(int)uVar41 >> 4,
                      uVar49 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            p_Var6 = this->_vptr_Padding_x86_avx512[-3];
            vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var6)));
            iVar52 = *(int *)(&this->field_0xd0 + (long)p_Var6);
            iVar55 = *(int *)(&this->field_0xd4 + (long)p_Var6);
            iVar61 = iVar52 + 0xf;
            if (-1 < iVar52) {
              iVar61 = iVar52;
            }
            iVar52 = iVar55 + 0xf;
            if (-1 < iVar55) {
              iVar52 = iVar55;
            }
            v_04[1] = (float)iVar38;
            v_04[0] = (float)in_stack_fffffffffffffe88;
            v_04._8_8_ = this;
            v_04[4] = (float)in_stack_fffffffffffffe98;
            v_04[5] = (float)iVar67;
            v_04[6] = (float)in_stack_fffffffffffffea0;
            v_04[7] = in_stack_fffffffffffffea4;
            v_04._32_8_ = m_1.data;
            v_04[10] = (float)m_1.refcount._0_4_;
            v_04[0xb] = (float)m_1.refcount._4_4_;
            v_04[0xc] = (float)(undefined4)m_1.elemsize;
            v_04[0xd] = (float)m_1.elemsize._4_4_;
            v_04[0xe] = (float)m_1.elempack;
            v_04[0xf] = (float)m_1._28_4_;
            padding_constant_pack16_avx512
                      (bottom_blob,top_blob,iVar61 >> 4,iVar52 >> 4,
                       *(int *)(&this->field_0xd8 + (long)p_Var6),
                       *(int *)(&this->field_0xdc + (long)p_Var6),v_04);
            unaff_EBP = 0;
          }
          bVar9 = false;
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 3) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = *(uint *)(&this->field_0xe8 + (long)p_Var6) + uVar42 * 0x10 +
                 *(int *)(&this->field_0xec + (long)p_Var6);
        if ((uVar39 & 0xf) == 0) {
          cVar50 = '\x10';
        }
        else if ((uVar39 & 7) == 0) {
          cVar50 = '\b';
        }
        else {
          cVar50 = ((uVar39 & 3) == 0) * '\x03' + '\x01';
        }
        bVar9 = true;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var6) & 0xf) == 0) && (cVar50 == '\x10')) {
          puVar34 = &this->field_0xd8;
          puVar35 = &this->field_0xd0;
          puVar36 = &this->field_0xdc;
          puVar37 = &this->field_0xd4;
          if ((uVar39 == uVar42 * 0x10) || (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
            uVar41 = uVar39 + 0xf;
            if (-1 < (int)uVar39) {
              uVar41 = uVar39;
            }
            this = pPVar76;
            Mat::create(top_blob,*(int *)(puVar34 + (long)p_Var6) + iVar3 +
                                 *(int *)(puVar36 + (long)p_Var6),
                        *(int *)(puVar35 + (long)p_Var6) + iVar4 + *(int *)(puVar37 + (long)p_Var6),
                        (int)uVar41 >> 4,uVar49 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
            unaff_EBP = -100;
            pPVar76 = this;
            if (top_blob->data == (void *)0x0) {
              bVar9 = false;
            }
            else {
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar52 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
                iVar55 = iVar52 + 0xf;
                if (-1 < iVar52) {
                  iVar55 = iVar52;
                }
                if (0xf < (int)uVar39) {
                  in_stack_fffffffffffffea0 = -(iVar55 >> 4);
                  uVar69 = 0;
                  uVar39 = in_stack_fffffffffffffea0;
                  do {
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    uVar63 = top_blob->elemsize;
                    pauVar46 = (undefined1 (*) [64])
                               (top_blob->cstep * uVar69 * uVar63 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)uVar63;
                    m.elemsize._4_4_ = (undefined4)(uVar63 >> 0x20);
                    m.d = 1;
                    sVar51 = (long)m.h * (long)top_blob->w;
                    m.w = top_blob->w;
                    m.dims = top_blob->dims + -1;
                    m.cstep = (uVar63 * sVar51 + 0xf & 0xfffffffffffffff0) / uVar63;
                    if (top_blob->dims == 4) {
                      m.cstep = sVar51;
                    }
                    p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                    if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                      auVar70 = vbroadcastss_avx512f
                                          (ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var6)));
                    }
                    else {
                      auVar70 = *(undefined1 (*) [64])
                                 (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar69 * 0x40);
                    }
                    uVar40 = uVar39 + (int)uVar69;
                    m.data = pauVar46;
                    if ((int)uVar40 < 0 || (int)uVar42 <= (int)uVar40) {
                      iVar52 = m.c * (int)m.cstep;
                      if (0 < iVar52) {
                        do {
                          *pauVar46 = auVar70;
                          pauVar46 = pauVar46 + 1;
                          iVar52 = iVar52 + -1;
                        } while (iVar52 != 0);
                      }
                    }
                    else {
                      m_1.w = bottom_blob->w;
                      m_1.h = bottom_blob->h;
                      m_1.c = bottom_blob->d;
                      uVar63 = bottom_blob->elemsize;
                      pauVar64 = (undefined1 (*) [64])
                                 ((ulong)uVar40 * bottom_blob->cstep * uVar63 +
                                 (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)uVar63;
                      m_1.elemsize._4_4_ = (undefined4)(uVar63 >> 0x20);
                      m_1.d = 1;
                      m_1.dims = bottom_blob->dims + -1;
                      m_1.cstep = (uVar63 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                                  uVar63;
                      if (bottom_blob->dims == 4) {
                        m_1.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                      m_1.data = pauVar64;
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0) {
                        puVar34 = &this->field_0xd0;
                        puVar35 = &this->field_0xd4;
                        puVar36 = &this->field_0xd8;
                        puVar37 = &this->field_0xdc;
                        v_05[1] = (float)iVar38;
                        v_05[0] = (float)in_stack_fffffffffffffe88;
                        v_05._8_8_ = pPVar76;
                        v_05[4] = (float)in_stack_fffffffffffffe98;
                        v_05[5] = (float)iVar67;
                        v_05[6] = (float)in_stack_fffffffffffffea0;
                        v_05[7] = in_stack_fffffffffffffea4;
                        v_05._32_8_ = pauVar64;
                        v_05[10] = 0.0;
                        v_05[0xb] = 0.0;
                        v_05[0xc] = (float)(undefined4)m_1.elemsize;
                        v_05[0xd] = (float)m_1.elemsize._4_4_;
                        v_05[0xe] = (float)m_1.elempack;
                        v_05[0xf] = (float)m_1._28_4_;
                        this = pPVar76;
                        padding_constant_pack16_avx512
                                  (&m_1,&m,*(int *)(puVar34 + (long)p_Var6),
                                   *(int *)(puVar35 + (long)p_Var6),*(int *)(puVar36 + (long)p_Var6)
                                   ,*(int *)(puVar37 + (long)p_Var6),v_05);
                        pPVar76 = this;
                      }
                      pp_Var7 = this->_vptr_Padding_x86_avx512;
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 1) {
                        iVar52 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                        iVar55 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                        iVar61 = *(int *)(&this->field_0xd8 + (long)p_Var6);
                        iVar45 = *(int *)(&this->field_0xdc + (long)p_Var6);
                        if (0 < iVar52) {
                          iVar53 = 0;
                          do {
                            auVar70 = *pauVar64;
                            iVar54 = iVar61;
                            if (0 < iVar61) {
                              do {
                                *pauVar46 = auVar70;
                                pauVar46 = pauVar46 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              pauVar57 = pauVar64;
                              do {
                                auVar70 = *pauVar57;
                                *pauVar46 = auVar70;
                                pauVar57 = pauVar57 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            iVar54 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar46 = auVar70;
                                pauVar46 = pauVar46 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            iVar53 = iVar53 + 1;
                          } while (iVar53 != iVar52);
                        }
                        if (0 < m_1.h) {
                          iVar52 = 0;
                          do {
                            auVar70 = *pauVar64;
                            iVar53 = iVar61;
                            if (0 < iVar61) {
                              do {
                                *pauVar46 = auVar70;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + -1;
                              } while (iVar53 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar53 = 0;
                              do {
                                auVar70 = *pauVar64;
                                *pauVar46 = auVar70;
                                pauVar64 = pauVar64 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + 1;
                              } while (iVar53 < m_1.w);
                            }
                            iVar53 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar46 = auVar70;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + -1;
                              } while (iVar53 != 0);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 < m_1.h);
                        }
                        if (0 < iVar55) {
                          iVar52 = 0;
                          do {
                            auVar70 = pauVar64[-(long)m_1.w];
                            iVar53 = iVar61;
                            if (0 < iVar61) {
                              do {
                                *pauVar46 = auVar70;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + -1;
                              } while (iVar53 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar53 = 0;
                              pauVar57 = pauVar64 + -(long)m_1.w;
                              do {
                                auVar70 = *pauVar57;
                                *pauVar46 = auVar70;
                                pauVar57 = pauVar57 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + 1;
                              } while (iVar53 < m_1.w);
                            }
                            iVar53 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar46 = auVar70;
                                pauVar46 = pauVar46 + 1;
                                iVar53 = iVar53 + -1;
                              } while (iVar53 != 0);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 != iVar55);
                        }
                      }
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 2) {
                        iVar52 = *(int *)(&pPVar76->field_0xd0 + (long)p_Var6);
                        iVar55 = *(int *)(&pPVar76->field_0xd4 + (long)p_Var6);
                        uVar39 = *(uint *)(&pPVar76->field_0xd8 + (long)p_Var6);
                        uVar63 = (ulong)uVar39;
                        uVar40 = *(uint *)(&pPVar76->field_0xdc + (long)p_Var6);
                        uVar62 = (ulong)uVar40;
                        pauVar64 = (undefined1 (*) [64])
                                   ((long)(m_1.w * iVar52 * 0x10) * 4 + (long)m_1.data);
                        pauVar46 = (undefined1 (*) [64])m.data;
                        if (0 < iVar52) {
                          iVar61 = 0;
                          do {
                            lVar68 = uVar63 << 6;
                            if (0 < (int)uVar39) {
                              do {
                                *pauVar46 = *(undefined1 (*) [64])(*pauVar64 + lVar68);
                                pauVar46 = pauVar46 + 1;
                                lVar68 = lVar68 + -0x40;
                              } while (lVar68 != 0);
                            }
                            pauVar57 = pauVar64;
                            if (0 < m_1.w) {
                              iVar45 = 0;
                              do {
                                *pauVar46 = *pauVar57;
                                pauVar57 = pauVar57 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar45 = iVar45 + 1;
                              } while (iVar45 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x80;
                              do {
                                *pauVar46 = *(undefined1 (*) [64])(*pauVar57 + lVar68);
                                pauVar46 = pauVar46 + 1;
                                lVar1 = uVar62 * 0x40 + lVar68;
                                lVar68 = lVar68 + -0x40;
                              } while (lVar1 != -0x40);
                            }
                            pauVar64 = pauVar64 + -(long)m_1.w;
                            iVar61 = iVar61 + 1;
                          } while (iVar61 != iVar52);
                        }
                        if (0 < m_1.h) {
                          iVar52 = 0;
                          do {
                            lVar68 = uVar63 << 6;
                            if (0 < (int)uVar39) {
                              do {
                                *pauVar46 = *(undefined1 (*) [64])(*pauVar64 + lVar68);
                                pauVar46 = pauVar46 + 1;
                                lVar68 = lVar68 + -0x40;
                              } while (lVar68 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar61 = 0;
                              do {
                                *pauVar46 = *pauVar64;
                                pauVar64 = pauVar64 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar61 = iVar61 + 1;
                              } while (iVar61 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x80;
                              do {
                                *pauVar46 = *(undefined1 (*) [64])(*pauVar64 + lVar68);
                                pauVar46 = pauVar46 + 1;
                                lVar1 = uVar62 * 0x40 + lVar68;
                                lVar68 = lVar68 + -0x40;
                              } while (lVar1 != -0x40);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 < m_1.h);
                        }
                        if (0 < iVar55) {
                          pauVar64 = pauVar64 + (long)m_1.w * -2;
                          iVar52 = 0;
                          do {
                            lVar68 = uVar63 << 6;
                            if (0 < (int)uVar39) {
                              do {
                                *pauVar46 = *(undefined1 (*) [64])(*pauVar64 + lVar68);
                                pauVar46 = pauVar46 + 1;
                                lVar68 = lVar68 + -0x40;
                              } while (lVar68 != 0);
                            }
                            pauVar57 = pauVar64;
                            if (0 < m_1.w) {
                              iVar61 = 0;
                              do {
                                *pauVar46 = *pauVar57;
                                pauVar57 = pauVar57 + 1;
                                pauVar46 = pauVar46 + 1;
                                iVar61 = iVar61 + 1;
                              } while (iVar61 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x80;
                              do {
                                *pauVar46 = *(undefined1 (*) [64])(*pauVar57 + lVar68);
                                pauVar46 = pauVar46 + 1;
                                lVar1 = uVar62 * 0x40 + lVar68;
                                lVar68 = lVar68 + -0x40;
                              } while (lVar1 != -0x40);
                            }
                            pauVar64 = pauVar64 + -(long)m_1.w;
                            iVar52 = iVar52 + 1;
                          } while (iVar52 != iVar55);
                        }
                      }
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      this = pPVar76;
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                              this = pPVar76;
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                            this = pPVar76;
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      pPVar76 = this;
                      uVar39 = in_stack_fffffffffffffea0;
                    }
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            this = pPVar76;
                            free(m.data);
                            pPVar76 = this;
                            uVar39 = in_stack_fffffffffffffea0;
                          }
                        }
                        else {
                          this = pPVar76;
                          (*(m.allocator)->_vptr_Allocator[3])();
                          pPVar76 = this;
                          uVar39 = in_stack_fffffffffffffea0;
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != (uint)((int)uVar41 >> 4));
                }
                unaff_EBP = 0;
              }
              bVar9 = false;
            }
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 4) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        iVar52 = *(int *)(&this->field_0xe0 + (long)p_Var6);
        if (iVar52 == 0) {
          uVar39 = *(int *)(&this->field_0xe8 + (long)p_Var6) + iVar5 +
                   *(int *)(&this->field_0xec + (long)p_Var6);
          puVar34 = &this->field_0xd0;
          puVar35 = &this->field_0xd4;
          puVar36 = &this->field_0xd8;
          puVar37 = &this->field_0xdc;
          this = pPVar76;
          Mat::create(top_blob,*(int *)(puVar36 + (long)p_Var6) + iVar3 +
                               *(int *)(puVar37 + (long)p_Var6),
                      *(int *)(puVar34 + (long)p_Var6) + iVar4 + *(int *)(puVar35 + (long)p_Var6),
                      uVar39,uVar42,uVar49,0x10,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)uVar42 < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar69 = (ulong)uVar39;
              uVar63 = 0;
              in_stack_fffffffffffffea4 = 0.0;
              in_stack_fffffffffffffea0 = uVar39;
              do {
                p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                  auVar70 = vbroadcastss_avx512f
                                      (ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var6)));
                }
                else {
                  auVar70 = *(undefined1 (*) [64])
                             (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar63 * 0x40);
                }
                if (0 < (int)uVar39) {
                  uVar62 = 0;
                  do {
                    sVar51 = top_blob->elemsize;
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    sVar60 = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar62 * sVar51 * sVar60 + top_blob->cstep * uVar63 * sVar51);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar51;
                    m.elemsize._4_4_ = (undefined4)(sVar51 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    uVar41 = (int)uVar62 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
                    if ((int)uVar41 < 0 || iVar5 <= (int)uVar41) {
                      m.cstep._0_4_ = (int)sVar60;
                      pauVar46 = (undefined1 (*) [64])m.data;
                      if (0 < (int)m.cstep) {
                        do {
                          *pauVar46 = auVar70;
                          m.cstep._0_4_ = (int)m.cstep + -1;
                          pauVar46 = pauVar46 + 1;
                        } while ((int)m.cstep != 0);
                      }
                    }
                    else {
                      m_1.h = bottom_blob->h;
                      sVar51 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar51 * (ulong)uVar41 +
                                         bottom_blob->cstep * uVar63 * sVar51);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar51;
                      m_1.elemsize._4_4_ = (undefined4)(sVar51 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                      v_06[1] = (float)iVar38;
                      v_06[0] = (float)in_stack_fffffffffffffe88;
                      v_06._8_8_ = pPVar76;
                      v_06[4] = (float)in_stack_fffffffffffffe98;
                      v_06[5] = (float)iVar67;
                      v_06[6] = (float)in_stack_fffffffffffffea0;
                      v_06[7] = in_stack_fffffffffffffea4;
                      v_06._32_8_ = m_1.data;
                      v_06[10] = 0.0;
                      v_06[0xb] = 0.0;
                      v_06[0xc] = (float)(undefined4)m_1.elemsize;
                      v_06[0xd] = (float)m_1.elemsize._4_4_;
                      v_06[0xe] = (float)m_1.elempack;
                      v_06[0xf] = (float)m_1._28_4_;
                      m.cstep = sVar60;
                      padding_constant_pack16_avx512
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var6),
                                 *(int *)(&this->field_0xd4 + (long)p_Var6),
                                 *(int *)(&this->field_0xd8 + (long)p_Var6),
                                 *(int *)(&this->field_0xdc + (long)p_Var6),v_06);
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      this = pPVar76;
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                              this = pPVar76;
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                            this = pPVar76;
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      uVar69 = CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
                      pPVar76 = this;
                      sVar60 = m.cstep;
                    }
                    m.cstep = sVar60;
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            this = pPVar76;
                            free(m.data);
                            pPVar76 = this;
                          }
                        }
                        else {
                          this = pPVar76;
                          (*(m.allocator)->_vptr_Allocator[3])();
                          pPVar76 = this;
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar69);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar43);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar52 == 0) {
          return unaff_EBP;
        }
      }
    }
    if (iVar38 == 8) {
      if (iVar67 == 1) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = *(uint *)(&this->field_0xd8 + (long)p_Var6) + iVar3 * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var6);
        sVar44 = 3;
        if ((uVar39 & 7) != 0) {
          sVar44 = ((uVar39 & 3) == 0) * '\x02';
        }
        bVar9 = true;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var6) | uVar39) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          uVar41 = uVar39 + 7;
          if (-1 < (int)uVar39) {
            uVar41 = uVar39;
          }
          this = pPVar76;
          Mat::create(top_blob,(int)uVar41 >> 3,(uVar49 >> 3) << sVar44,8,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if (top_blob->data == (void *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar52 = *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx512[-3]);
              iVar55 = *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx512[-3]);
              iVar61 = iVar52 + 7;
              if (-1 < iVar52) {
                iVar61 = iVar52;
              }
              iVar52 = iVar55 + 7;
              if (-1 < iVar55) {
                iVar52 = iVar55;
              }
              v_00[1] = (float)iVar38;
              v_00[0] = (float)in_stack_fffffffffffffe88;
              v_00._8_8_ = this;
              v_00[4] = (float)in_stack_fffffffffffffe98;
              v_00[5] = (float)iVar67;
              v_00[6] = (float)in_stack_fffffffffffffea0;
              v_00[7] = in_stack_fffffffffffffea4;
              padding_constant_pack8_avx(bottom_blob,top_blob,0,0,iVar61 >> 3,iVar52 >> 3,v_00);
              unaff_EBP = 0;
              pPVar76 = this;
            }
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 2) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = *(uint *)(&this->field_0xd0 + (long)p_Var6) + iVar4 * 8 +
                 *(int *)(&this->field_0xd4 + (long)p_Var6);
        sVar44 = 3;
        if ((uVar39 & 7) != 0) {
          sVar44 = ((uVar39 & 3) == 0) * '\x02';
        }
        bVar9 = true;
        if ((((*(uint *)(&this->field_0xd0 + (long)p_Var6) | uVar39) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          puVar34 = &this->field_0xd8;
          puVar35 = &this->field_0xdc;
          uVar41 = uVar39 + 7;
          if (-1 < (int)uVar39) {
            uVar41 = uVar39;
          }
          this = pPVar76;
          Mat::create(top_blob,*(int *)(puVar34 + (long)p_Var6) + iVar3 +
                               *(int *)(puVar35 + (long)p_Var6),(int)uVar41 >> 3,
                      (uVar49 >> 3) << sVar44,8,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if ((top_blob->data == (void *)0x0) ||
             (bVar9 = false, (long)top_blob->c * top_blob->cstep == 0)) {
            bVar9 = false;
          }
          else {
            p_Var6 = this->_vptr_Padding_x86_avx512[-3];
            iVar52 = *(int *)(&this->field_0xd0 + (long)p_Var6);
            iVar55 = *(int *)(&this->field_0xd4 + (long)p_Var6);
            iVar61 = iVar52 + 7;
            if (-1 < iVar52) {
              iVar61 = iVar52;
            }
            iVar52 = iVar55 + 7;
            if (-1 < iVar55) {
              iVar52 = iVar55;
            }
            v_01[1] = (float)iVar38;
            v_01[0] = (float)in_stack_fffffffffffffe88;
            v_01._8_8_ = this;
            v_01[4] = (float)in_stack_fffffffffffffe98;
            v_01[5] = (float)iVar67;
            v_01[6] = (float)in_stack_fffffffffffffea0;
            v_01[7] = in_stack_fffffffffffffea4;
            padding_constant_pack8_avx
                      (bottom_blob,top_blob,iVar61 >> 3,iVar52 >> 3,
                       *(int *)(&this->field_0xd8 + (long)p_Var6),
                       *(int *)(&this->field_0xdc + (long)p_Var6),v_01);
            unaff_EBP = 0;
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 3) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = *(uint *)(&this->field_0xe8 + (long)p_Var6) + uVar42 * 8 +
                 *(int *)(&this->field_0xec + (long)p_Var6);
        sVar44 = 3;
        if ((uVar39 & 7) != 0) {
          sVar44 = ((uVar39 & 3) == 0) * '\x02';
        }
        bVar9 = true;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var6) | uVar39) & 7) == 0) {
          puVar34 = &this->field_0xd8;
          puVar35 = &this->field_0xdc;
          puVar36 = &this->field_0xd0;
          puVar37 = &this->field_0xd4;
          if ((uVar39 == uVar42 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
            uVar41 = uVar39 + 7;
            if (-1 < (int)uVar39) {
              uVar41 = uVar39;
            }
            this = pPVar76;
            Mat::create(top_blob,*(int *)(puVar34 + (long)p_Var6) + iVar3 +
                                 *(int *)(puVar35 + (long)p_Var6),
                        *(int *)(puVar36 + (long)p_Var6) + iVar4 + *(int *)(puVar37 + (long)p_Var6),
                        (int)uVar41 >> 3,(uVar49 >> 3) << sVar44,8,opt->blob_allocator);
            unaff_EBP = -100;
            pPVar76 = this;
            if (top_blob->data == (void *)0x0) {
              bVar9 = false;
            }
            else {
              unaff_EBP = -100;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar52 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
                iVar55 = iVar52 + 7;
                if (-1 < iVar52) {
                  iVar55 = iVar52;
                }
                if (7 < (int)uVar39) {
                  iVar55 = -(iVar55 >> 3);
                  uVar69 = 0;
                  iVar52 = iVar55;
                  do {
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    uVar63 = top_blob->elemsize;
                    pauVar47 = (undefined1 (*) [32])
                               (top_blob->cstep * uVar69 * uVar63 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)uVar63;
                    m.elemsize._4_4_ = (undefined4)(uVar63 >> 0x20);
                    m.d = 1;
                    sVar51 = (long)m.h * (long)top_blob->w;
                    m.w = top_blob->w;
                    m.dims = top_blob->dims + -1;
                    m.cstep = (uVar63 * sVar51 + 0xf & 0xfffffffffffffff0) / uVar63;
                    if (top_blob->dims == 4) {
                      m.cstep = sVar51;
                    }
                    p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                    if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                      uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                      auVar73._4_4_ = uVar2;
                      auVar73._0_4_ = uVar2;
                      auVar73._8_4_ = uVar2;
                      auVar73._12_4_ = uVar2;
                      auVar73._16_4_ = uVar2;
                      auVar73._20_4_ = uVar2;
                      auVar73._24_4_ = uVar2;
                      auVar73._28_4_ = uVar2;
                    }
                    else {
                      auVar73 = *(undefined1 (*) [32])
                                 (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar69 * 0x20);
                    }
                    uVar39 = iVar52 + (int)uVar69;
                    m.data = pauVar47;
                    if ((int)uVar39 < 0 || (int)uVar42 <= (int)uVar39) {
                      iVar61 = m.c * (int)m.cstep;
                      if (0 < iVar61) {
                        do {
                          *pauVar47 = auVar73;
                          pauVar47 = pauVar47 + 1;
                          iVar61 = iVar61 + -1;
                        } while (iVar61 != 0);
                      }
                    }
                    else {
                      m_1.w = bottom_blob->w;
                      m_1.h = bottom_blob->h;
                      m_1.c = bottom_blob->d;
                      uVar63 = bottom_blob->elemsize;
                      pauVar65 = (undefined1 (*) [32])
                                 ((ulong)uVar39 * bottom_blob->cstep * uVar63 +
                                 (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)uVar63;
                      m_1.elemsize._4_4_ = (undefined4)(uVar63 >> 0x20);
                      m_1.d = 1;
                      m_1.dims = bottom_blob->dims + -1;
                      m_1.cstep = (uVar63 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                                  uVar63;
                      if (bottom_blob->dims == 4) {
                        m_1.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                      m_1.data = pauVar65;
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0) {
                        puVar34 = &this->field_0xd0;
                        puVar35 = &this->field_0xd4;
                        puVar36 = &this->field_0xd8;
                        puVar37 = &this->field_0xdc;
                        v[1] = (float)iVar38;
                        v[0] = (float)in_stack_fffffffffffffe88;
                        v._8_8_ = pPVar76;
                        v[4] = (float)in_stack_fffffffffffffe98;
                        v[5] = (float)iVar67;
                        v[6] = (float)iVar55;
                        v[7] = in_stack_fffffffffffffea4;
                        this = pPVar76;
                        padding_constant_pack8_avx
                                  (&m_1,&m,*(int *)(puVar34 + (long)p_Var6),
                                   *(int *)(puVar35 + (long)p_Var6),*(int *)(puVar36 + (long)p_Var6)
                                   ,*(int *)(puVar37 + (long)p_Var6),v);
                        pPVar76 = this;
                      }
                      pp_Var7 = this->_vptr_Padding_x86_avx512;
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 1) {
                        iVar52 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                        iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                        iVar45 = *(int *)(&this->field_0xd8 + (long)p_Var6);
                        iVar53 = *(int *)(&this->field_0xdc + (long)p_Var6);
                        if (0 < iVar52) {
                          iVar54 = 0;
                          do {
                            auVar73 = *pauVar65;
                            iVar56 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar47 = auVar73;
                                pauVar47 = pauVar47 + 1;
                                iVar56 = iVar56 + -1;
                              } while (iVar56 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar56 = 0;
                              pauVar58 = pauVar65;
                              do {
                                auVar73 = *pauVar58;
                                *pauVar47 = auVar73;
                                pauVar58 = pauVar58 + 1;
                                pauVar47 = pauVar47 + 1;
                                iVar56 = iVar56 + 1;
                              } while (iVar56 < m_1.w);
                            }
                            iVar56 = iVar53;
                            if (0 < iVar53) {
                              do {
                                *pauVar47 = auVar73;
                                pauVar47 = pauVar47 + 1;
                                iVar56 = iVar56 + -1;
                              } while (iVar56 != 0);
                            }
                            iVar54 = iVar54 + 1;
                          } while (iVar54 != iVar52);
                        }
                        if (0 < m_1.h) {
                          iVar52 = 0;
                          do {
                            auVar73 = *pauVar65;
                            iVar54 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar47 = auVar73;
                                pauVar47 = pauVar47 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              do {
                                auVar73 = *pauVar65;
                                *pauVar47 = auVar73;
                                pauVar65 = pauVar65 + 1;
                                pauVar47 = pauVar47 + 1;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            iVar54 = iVar53;
                            if (0 < iVar53) {
                              do {
                                *pauVar47 = auVar73;
                                pauVar47 = pauVar47 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 < m_1.h);
                        }
                        if (0 < iVar61) {
                          iVar52 = 0;
                          do {
                            auVar73 = pauVar65[-(long)m_1.w];
                            iVar54 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar47 = auVar73;
                                pauVar47 = pauVar47 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              pauVar58 = pauVar65 + -(long)m_1.w;
                              do {
                                auVar73 = *pauVar58;
                                *pauVar47 = auVar73;
                                pauVar58 = pauVar58 + 1;
                                pauVar47 = pauVar47 + 1;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            iVar54 = iVar53;
                            if (0 < iVar53) {
                              do {
                                *pauVar47 = auVar73;
                                pauVar47 = pauVar47 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 != iVar61);
                        }
                      }
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 2) {
                        iVar52 = *(int *)(&pPVar76->field_0xd0 + (long)p_Var6);
                        iVar61 = *(int *)(&pPVar76->field_0xd4 + (long)p_Var6);
                        uVar39 = *(uint *)(&pPVar76->field_0xd8 + (long)p_Var6);
                        uVar63 = (ulong)uVar39;
                        uVar40 = *(uint *)(&pPVar76->field_0xdc + (long)p_Var6);
                        uVar62 = (ulong)uVar40;
                        pauVar65 = (undefined1 (*) [32])
                                   ((long)(m_1.w * iVar52 * 8) * 4 + (long)m_1.data);
                        pauVar47 = (undefined1 (*) [32])m.data;
                        if (0 < iVar52) {
                          iVar45 = 0;
                          do {
                            lVar68 = uVar63 << 5;
                            if (0 < (int)uVar39) {
                              do {
                                *pauVar47 = *(undefined1 (*) [32])(*pauVar65 + lVar68);
                                pauVar47 = pauVar47 + 1;
                                lVar68 = lVar68 + -0x20;
                              } while (lVar68 != 0);
                            }
                            pauVar58 = pauVar65;
                            if (0 < m_1.w) {
                              iVar53 = 0;
                              do {
                                *pauVar47 = *pauVar58;
                                pauVar58 = pauVar58 + 1;
                                pauVar47 = pauVar47 + 1;
                                iVar53 = iVar53 + 1;
                              } while (iVar53 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x40;
                              do {
                                *pauVar47 = *(undefined1 (*) [32])(*pauVar58 + lVar68);
                                pauVar47 = pauVar47 + 1;
                                lVar1 = uVar62 * 0x20 + lVar68;
                                lVar68 = lVar68 + -0x20;
                              } while (lVar1 != -0x20);
                            }
                            pauVar65 = pauVar65 + -(long)m_1.w;
                            iVar45 = iVar45 + 1;
                          } while (iVar45 != iVar52);
                        }
                        if (0 < m_1.h) {
                          iVar52 = 0;
                          do {
                            lVar68 = uVar63 << 5;
                            if (0 < (int)uVar39) {
                              do {
                                *pauVar47 = *(undefined1 (*) [32])(*pauVar65 + lVar68);
                                pauVar47 = pauVar47 + 1;
                                lVar68 = lVar68 + -0x20;
                              } while (lVar68 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar45 = 0;
                              do {
                                *pauVar47 = *pauVar65;
                                pauVar65 = pauVar65 + 1;
                                pauVar47 = pauVar47 + 1;
                                iVar45 = iVar45 + 1;
                              } while (iVar45 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x40;
                              do {
                                *pauVar47 = *(undefined1 (*) [32])(*pauVar65 + lVar68);
                                pauVar47 = pauVar47 + 1;
                                lVar1 = uVar62 * 0x20 + lVar68;
                                lVar68 = lVar68 + -0x20;
                              } while (lVar1 != -0x20);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 < m_1.h);
                        }
                        if (0 < iVar61) {
                          pauVar65 = pauVar65 + (long)m_1.w * -2;
                          iVar52 = 0;
                          do {
                            lVar68 = uVar63 << 5;
                            if (0 < (int)uVar39) {
                              do {
                                *pauVar47 = *(undefined1 (*) [32])(*pauVar65 + lVar68);
                                pauVar47 = pauVar47 + 1;
                                lVar68 = lVar68 + -0x20;
                              } while (lVar68 != 0);
                            }
                            pauVar58 = pauVar65;
                            if (0 < m_1.w) {
                              iVar45 = 0;
                              do {
                                *pauVar47 = *pauVar58;
                                pauVar58 = pauVar58 + 1;
                                pauVar47 = pauVar47 + 1;
                                iVar45 = iVar45 + 1;
                              } while (iVar45 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x40;
                              do {
                                *pauVar47 = *(undefined1 (*) [32])(*pauVar58 + lVar68);
                                pauVar47 = pauVar47 + 1;
                                lVar1 = uVar62 * 0x20 + lVar68;
                                lVar68 = lVar68 + -0x20;
                              } while (lVar1 != -0x20);
                            }
                            pauVar65 = pauVar65 + -(long)m_1.w;
                            iVar52 = iVar52 + 1;
                          } while (iVar52 != iVar61);
                        }
                      }
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      this = pPVar76;
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                              this = pPVar76;
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                            this = pPVar76;
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      pPVar76 = this;
                      iVar52 = iVar55;
                    }
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            this = pPVar76;
                            free(m.data);
                            pPVar76 = this;
                            iVar52 = iVar55;
                          }
                        }
                        else {
                          this = pPVar76;
                          (*(m.allocator)->_vptr_Allocator[3])();
                          pPVar76 = this;
                          iVar52 = iVar55;
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != (uint)((int)uVar41 >> 3));
                }
                unaff_EBP = 0;
              }
              bVar9 = false;
            }
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 4) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        iVar52 = *(int *)(&this->field_0xe0 + (long)p_Var6);
        if (iVar52 == 0) {
          uVar39 = *(int *)(&this->field_0xe8 + (long)p_Var6) + iVar5 +
                   *(int *)(&this->field_0xec + (long)p_Var6);
          puVar34 = &this->field_0xd0;
          puVar35 = &this->field_0xd4;
          puVar36 = &this->field_0xd8;
          puVar37 = &this->field_0xdc;
          this = pPVar76;
          Mat::create(top_blob,*(int *)(puVar36 + (long)p_Var6) + iVar3 +
                               *(int *)(puVar37 + (long)p_Var6),
                      *(int *)(puVar34 + (long)p_Var6) + iVar4 + *(int *)(puVar35 + (long)p_Var6),
                      uVar39,uVar42,uVar49,8,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)uVar42 < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar69 = (ulong)uVar39;
              uVar63 = 0;
              fVar77 = 0.0;
              uVar41 = uVar39;
              do {
                p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                  auVar74._4_4_ = uVar2;
                  auVar74._0_4_ = uVar2;
                  auVar74._8_4_ = uVar2;
                  auVar74._12_4_ = uVar2;
                  auVar74._16_4_ = uVar2;
                  auVar74._20_4_ = uVar2;
                  auVar74._24_4_ = uVar2;
                  auVar74._28_4_ = uVar2;
                }
                else {
                  auVar74 = *(undefined1 (*) [32])
                             (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar63 * 0x20);
                }
                if (0 < (int)uVar39) {
                  uVar62 = 0;
                  do {
                    sVar51 = top_blob->elemsize;
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    sVar60 = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar62 * sVar51 * sVar60 + top_blob->cstep * uVar63 * sVar51);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar51;
                    m.elemsize._4_4_ = (undefined4)(sVar51 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    uVar40 = (int)uVar62 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
                    if ((int)uVar40 < 0 || iVar5 <= (int)uVar40) {
                      m.cstep._0_4_ = (int)sVar60;
                      pauVar47 = (undefined1 (*) [32])m.data;
                      if (0 < (int)m.cstep) {
                        do {
                          *pauVar47 = auVar74;
                          m.cstep._0_4_ = (int)m.cstep + -1;
                          pauVar47 = pauVar47 + 1;
                        } while ((int)m.cstep != 0);
                      }
                    }
                    else {
                      m_1.h = bottom_blob->h;
                      sVar51 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar51 * (ulong)uVar40 +
                                         bottom_blob->cstep * uVar63 * sVar51);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar51;
                      m_1.elemsize._4_4_ = (undefined4)(sVar51 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                      v_02[1] = (float)iVar38;
                      v_02[0] = (float)in_stack_fffffffffffffe88;
                      v_02._8_8_ = pPVar76;
                      v_02[4] = (float)in_stack_fffffffffffffe98;
                      v_02[5] = (float)iVar67;
                      v_02[6] = (float)uVar41;
                      v_02[7] = fVar77;
                      m.cstep = sVar60;
                      padding_constant_pack8_avx
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var6),
                                 *(int *)(&this->field_0xd4 + (long)p_Var6),
                                 *(int *)(&this->field_0xd8 + (long)p_Var6),
                                 *(int *)(&this->field_0xdc + (long)p_Var6),v_02);
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      this = pPVar76;
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                              this = pPVar76;
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                            this = pPVar76;
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      uVar69 = CONCAT44(fVar77,uVar41);
                      pPVar76 = this;
                      sVar60 = m.cstep;
                    }
                    m.cstep = sVar60;
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            this = pPVar76;
                            free(m.data);
                            pPVar76 = this;
                          }
                        }
                        else {
                          this = pPVar76;
                          (*(m.allocator)->_vptr_Allocator[3])();
                          pPVar76 = this;
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar62 = uVar62 + 1;
                  } while (uVar62 != uVar69);
                }
                uVar63 = uVar63 + 1;
              } while (uVar63 != uVar43);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar52 == 0) {
          return unaff_EBP;
        }
      }
    }
    if (iVar38 == 4) {
      if (iVar67 == 1) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = *(uint *)(&this->field_0xd8 + (long)p_Var6) + iVar3 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var6);
        sVar44 = 3;
        if ((uVar39 & 7) != 0) {
          sVar44 = ((uVar39 & 3) == 0) * '\x02';
        }
        bVar9 = true;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var6) & 3) == 0) && ((uVar39 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          this = pPVar76;
          Mat::create(top_blob,(int)uVar39 >> 2,(uVar49 >> 2) << sVar44,4,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if (top_blob->data == (void *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var6 = this->_vptr_Padding_x86_avx512[-3];
              v_08[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
              v_08[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
              iVar52 = *(int *)(&this->field_0xd8 + (long)p_Var6);
              iVar55 = *(int *)(&this->field_0xdc + (long)p_Var6);
              iVar61 = iVar52 + 3;
              if (-1 < iVar52) {
                iVar61 = iVar52;
              }
              iVar52 = iVar55 + 3;
              if (-1 < iVar55) {
                iVar52 = iVar55;
              }
              v_08[2] = (float)(int)in_XMM1_Qa;
              v_08[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
              padding_constant_pack4_sse(bottom_blob,top_blob,0,0,iVar61 >> 2,iVar52 >> 2,v_08);
              unaff_EBP = 0;
              pPVar76 = this;
            }
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 2) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = *(uint *)(&this->field_0xd0 + (long)p_Var6) + iVar4 * 4 +
                 *(int *)(&this->field_0xd4 + (long)p_Var6);
        sVar44 = 3;
        if ((uVar39 & 7) != 0) {
          sVar44 = ((uVar39 & 3) == 0) * '\x02';
        }
        bVar9 = true;
        if ((((*(uint *)(&this->field_0xd0 + (long)p_Var6) & 3) == 0) && ((uVar39 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          puVar34 = &this->field_0xd8;
          puVar35 = &this->field_0xdc;
          this = pPVar76;
          Mat::create(top_blob,*(int *)(puVar34 + (long)p_Var6) + iVar3 +
                               *(int *)(puVar35 + (long)p_Var6),(int)uVar39 >> 2,
                      (uVar49 >> 2) << sVar44,4,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if ((top_blob->data == (void *)0x0) ||
             (bVar9 = false, (long)top_blob->c * top_blob->cstep == 0)) {
            bVar9 = false;
          }
          else {
            p_Var6 = this->_vptr_Padding_x86_avx512[-3];
            v_07[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v_07[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            iVar52 = *(int *)(&this->field_0xd0 + (long)p_Var6);
            iVar55 = *(int *)(&this->field_0xd4 + (long)p_Var6);
            iVar61 = iVar52 + 3;
            if (-1 < iVar52) {
              iVar61 = iVar52;
            }
            iVar52 = iVar55 + 3;
            if (-1 < iVar55) {
              iVar52 = iVar55;
            }
            v_07[2] = (float)(int)in_XMM1_Qa;
            v_07[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,iVar61 >> 2,iVar52 >> 2,
                       *(int *)(&this->field_0xd8 + (long)p_Var6),
                       *(int *)(&this->field_0xdc + (long)p_Var6),v_07);
            unaff_EBP = 0;
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 3) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        uVar39 = *(uint *)(&this->field_0xe8 + (long)p_Var6) + uVar42 * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var6);
        sVar44 = 3;
        if ((uVar39 & 7) != 0) {
          sVar44 = ((uVar39 & 3) == 0) * '\x02';
        }
        bVar9 = true;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var6) & 3) == 0) && ((uVar39 & 7) == 4)) {
          puVar34 = &this->field_0xd8;
          puVar35 = &this->field_0xdc;
          puVar36 = &this->field_0xd0;
          puVar37 = &this->field_0xd4;
          if ((uVar39 == uVar42 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
            uVar39 = (int)uVar39 >> 2;
            this = pPVar76;
            Mat::create(top_blob,*(int *)(puVar34 + (long)p_Var6) + iVar3 +
                                 *(int *)(puVar35 + (long)p_Var6),
                        *(int *)(puVar36 + (long)p_Var6) + iVar4 + *(int *)(puVar37 + (long)p_Var6),
                        uVar39,(uVar49 >> 2) << sVar44,4,opt->blob_allocator);
            unaff_EBP = -100;
            pPVar76 = this;
            if (top_blob->data == (void *)0x0) {
              bVar9 = false;
            }
            else {
              bVar9 = false;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar52 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
                iVar55 = iVar52 + 3;
                if (-1 < iVar52) {
                  iVar55 = iVar52;
                }
                if (0 < (int)uVar39) {
                  iVar55 = -(iVar55 >> 2);
                  uVar69 = 0;
                  iVar52 = iVar55;
                  do {
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    uVar63 = top_blob->elemsize;
                    pauVar48 = (undefined1 (*) [16])
                               (top_blob->cstep * uVar69 * uVar63 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)uVar63;
                    m.elemsize._4_4_ = (undefined4)(uVar63 >> 0x20);
                    m.d = 1;
                    sVar51 = (long)m.h * (long)top_blob->w;
                    m.w = top_blob->w;
                    m.dims = top_blob->dims + -1;
                    m.cstep = (uVar63 * sVar51 + 0xf & 0xfffffffffffffff0) / uVar63;
                    if (top_blob->dims == 4) {
                      m.cstep = sVar51;
                    }
                    p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                    if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                      uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                      auVar71._4_4_ = uVar2;
                      auVar71._0_4_ = uVar2;
                      auVar71._8_4_ = uVar2;
                      auVar71._12_4_ = uVar2;
                    }
                    else {
                      auVar71 = *(undefined1 (*) [16])
                                 (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar69 * 0x10);
                    }
                    uVar41 = iVar52 + (int)uVar69;
                    m.data = pauVar48;
                    if ((int)uVar41 < 0 || (int)uVar42 <= (int)uVar41) {
                      iVar61 = m.c * (int)m.cstep;
                      if (0 < iVar61) {
                        do {
                          *pauVar48 = auVar71;
                          pauVar48 = pauVar48 + 1;
                          iVar61 = iVar61 + -1;
                        } while (iVar61 != 0);
                      }
                    }
                    else {
                      m_1.w = bottom_blob->w;
                      m_1.h = bottom_blob->h;
                      m_1.c = bottom_blob->d;
                      uVar63 = bottom_blob->elemsize;
                      pauVar66 = (undefined1 (*) [16])
                                 ((ulong)uVar41 * bottom_blob->cstep * uVar63 +
                                 (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)uVar63;
                      m_1.elemsize._4_4_ = (undefined4)(uVar63 >> 0x20);
                      m_1.d = 1;
                      m_1.dims = bottom_blob->dims + -1;
                      m_1.cstep = (uVar63 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                                  uVar63;
                      if (bottom_blob->dims == 4) {
                        m_1.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                      m_1.data = pauVar66;
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0) {
                        puVar34 = &this->field_0xd0;
                        puVar35 = &this->field_0xd4;
                        puVar36 = &this->field_0xd8;
                        puVar37 = &this->field_0xdc;
                        v_09._0_8_ = auVar71._0_8_;
                        v_09[2] = 0.0;
                        v_09[3] = 0.0;
                        this = pPVar76;
                        padding_constant_pack4_sse
                                  (&m_1,&m,*(int *)(puVar34 + (long)p_Var6),
                                   *(int *)(puVar35 + (long)p_Var6),*(int *)(puVar36 + (long)p_Var6)
                                   ,*(int *)(puVar37 + (long)p_Var6),v_09);
                        pPVar76 = this;
                      }
                      pp_Var7 = this->_vptr_Padding_x86_avx512;
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 1) {
                        iVar52 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                        iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                        iVar45 = *(int *)(&this->field_0xd8 + (long)p_Var6);
                        iVar53 = *(int *)(&this->field_0xdc + (long)p_Var6);
                        if (0 < iVar52) {
                          iVar54 = 0;
                          do {
                            auVar71 = *pauVar66;
                            iVar56 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar48 = auVar71;
                                pauVar48 = pauVar48 + 1;
                                iVar56 = iVar56 + -1;
                              } while (iVar56 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar56 = 0;
                              pauVar59 = pauVar66;
                              do {
                                auVar71 = *pauVar59;
                                *pauVar48 = auVar71;
                                pauVar59 = pauVar59 + 1;
                                pauVar48 = pauVar48 + 1;
                                iVar56 = iVar56 + 1;
                              } while (iVar56 < m_1.w);
                            }
                            iVar56 = iVar53;
                            if (0 < iVar53) {
                              do {
                                *pauVar48 = auVar71;
                                pauVar48 = pauVar48 + 1;
                                iVar56 = iVar56 + -1;
                              } while (iVar56 != 0);
                            }
                            iVar54 = iVar54 + 1;
                          } while (iVar54 != iVar52);
                        }
                        if (0 < m_1.h) {
                          iVar52 = 0;
                          do {
                            auVar71 = *pauVar66;
                            iVar54 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar48 = auVar71;
                                pauVar48 = pauVar48 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              do {
                                auVar71 = *pauVar66;
                                *pauVar48 = auVar71;
                                pauVar66 = pauVar66 + 1;
                                pauVar48 = pauVar48 + 1;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            iVar54 = iVar53;
                            if (0 < iVar53) {
                              do {
                                *pauVar48 = auVar71;
                                pauVar48 = pauVar48 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 < m_1.h);
                        }
                        if (0 < iVar61) {
                          iVar52 = 0;
                          do {
                            auVar71 = pauVar66[-(long)m_1.w];
                            iVar54 = iVar45;
                            if (0 < iVar45) {
                              do {
                                *pauVar48 = auVar71;
                                pauVar48 = pauVar48 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar54 = 0;
                              pauVar59 = pauVar66 + -(long)m_1.w;
                              do {
                                auVar71 = *pauVar59;
                                *pauVar48 = auVar71;
                                pauVar59 = pauVar59 + 1;
                                pauVar48 = pauVar48 + 1;
                                iVar54 = iVar54 + 1;
                              } while (iVar54 < m_1.w);
                            }
                            iVar54 = iVar53;
                            if (0 < iVar53) {
                              do {
                                *pauVar48 = auVar71;
                                pauVar48 = pauVar48 + 1;
                                iVar54 = iVar54 + -1;
                              } while (iVar54 != 0);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 != iVar61);
                        }
                      }
                      p_Var6 = pp_Var7[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 2) {
                        iVar52 = *(int *)(&pPVar76->field_0xd0 + (long)p_Var6);
                        iVar61 = *(int *)(&pPVar76->field_0xd4 + (long)p_Var6);
                        uVar41 = *(uint *)(&pPVar76->field_0xd8 + (long)p_Var6);
                        uVar63 = (ulong)uVar41;
                        uVar40 = *(uint *)(&pPVar76->field_0xdc + (long)p_Var6);
                        uVar62 = (ulong)uVar40;
                        pauVar66 = (undefined1 (*) [16])
                                   ((long)(m_1.w * iVar52 * 4) * 4 + (long)m_1.data);
                        pauVar48 = (undefined1 (*) [16])m.data;
                        if (0 < iVar52) {
                          iVar45 = 0;
                          do {
                            lVar68 = uVar63 << 4;
                            if (0 < (int)uVar41) {
                              do {
                                *pauVar48 = *(undefined1 (*) [16])(*pauVar66 + lVar68);
                                pauVar48 = pauVar48 + 1;
                                lVar68 = lVar68 + -0x10;
                              } while (lVar68 != 0);
                            }
                            pauVar59 = pauVar66;
                            if (0 < m_1.w) {
                              iVar53 = 0;
                              do {
                                *pauVar48 = *pauVar59;
                                pauVar59 = pauVar59 + 1;
                                pauVar48 = pauVar48 + 1;
                                iVar53 = iVar53 + 1;
                              } while (iVar53 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x20;
                              do {
                                *pauVar48 = *(undefined1 (*) [16])(*pauVar59 + lVar68);
                                pauVar48 = pauVar48 + 1;
                                lVar1 = uVar62 * 0x10 + lVar68;
                                lVar68 = lVar68 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            pauVar66 = pauVar66 + -(long)m_1.w;
                            iVar45 = iVar45 + 1;
                          } while (iVar45 != iVar52);
                        }
                        if (0 < m_1.h) {
                          iVar52 = 0;
                          do {
                            lVar68 = uVar63 << 4;
                            if (0 < (int)uVar41) {
                              do {
                                *pauVar48 = *(undefined1 (*) [16])(*pauVar66 + lVar68);
                                pauVar48 = pauVar48 + 1;
                                lVar68 = lVar68 + -0x10;
                              } while (lVar68 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar45 = 0;
                              do {
                                *pauVar48 = *pauVar66;
                                pauVar66 = pauVar66 + 1;
                                pauVar48 = pauVar48 + 1;
                                iVar45 = iVar45 + 1;
                              } while (iVar45 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x20;
                              do {
                                *pauVar48 = *(undefined1 (*) [16])(*pauVar66 + lVar68);
                                pauVar48 = pauVar48 + 1;
                                lVar1 = uVar62 * 0x10 + lVar68;
                                lVar68 = lVar68 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            iVar52 = iVar52 + 1;
                          } while (iVar52 < m_1.h);
                        }
                        if (0 < iVar61) {
                          pauVar66 = pauVar66 + (long)m_1.w * -2;
                          iVar52 = 0;
                          do {
                            lVar68 = uVar63 << 4;
                            if (0 < (int)uVar41) {
                              do {
                                *pauVar48 = *(undefined1 (*) [16])(*pauVar66 + lVar68);
                                pauVar48 = pauVar48 + 1;
                                lVar68 = lVar68 + -0x10;
                              } while (lVar68 != 0);
                            }
                            pauVar59 = pauVar66;
                            if (0 < m_1.w) {
                              iVar45 = 0;
                              do {
                                *pauVar48 = *pauVar59;
                                pauVar59 = pauVar59 + 1;
                                pauVar48 = pauVar48 + 1;
                                iVar45 = iVar45 + 1;
                              } while (iVar45 < m_1.w);
                            }
                            if (0 < (int)uVar40) {
                              lVar68 = -0x20;
                              do {
                                *pauVar48 = *(undefined1 (*) [16])(*pauVar59 + lVar68);
                                pauVar48 = pauVar48 + 1;
                                lVar1 = uVar62 * 0x10 + lVar68;
                                lVar68 = lVar68 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            pauVar66 = pauVar66 + -(long)m_1.w;
                            iVar52 = iVar52 + 1;
                          } while (iVar52 != iVar61);
                        }
                      }
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      this = pPVar76;
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                              this = pPVar76;
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                            this = pPVar76;
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      pPVar76 = this;
                      iVar52 = iVar55;
                    }
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            this = pPVar76;
                            free(m.data);
                            pPVar76 = this;
                            iVar52 = iVar55;
                          }
                        }
                        else {
                          this = pPVar76;
                          (*(m.allocator)->_vptr_Allocator[3])();
                          pPVar76 = this;
                          iVar52 = iVar55;
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar69 = uVar69 + 1;
                  } while (uVar69 != uVar39);
                }
                bVar9 = false;
                unaff_EBP = 0;
              }
            }
          }
        }
        if (!bVar9) {
          return unaff_EBP;
        }
      }
      if (iVar67 == 4) {
        p_Var6 = this->_vptr_Padding_x86_avx512[-3];
        iVar67 = *(int *)(&this->field_0xe0 + (long)p_Var6);
        if (iVar67 == 0) {
          uVar39 = *(int *)(&this->field_0xe8 + (long)p_Var6) + iVar5 +
                   *(int *)(&this->field_0xec + (long)p_Var6);
          puVar34 = &this->field_0xd0;
          puVar35 = &this->field_0xd4;
          puVar36 = &this->field_0xd8;
          puVar37 = &this->field_0xdc;
          this = pPVar76;
          Mat::create(top_blob,iVar3 + *(int *)(puVar36 + (long)p_Var6) +
                               *(int *)(puVar37 + (long)p_Var6),
                      iVar4 + *(int *)(puVar34 + (long)p_Var6) + *(int *)(puVar35 + (long)p_Var6),
                      uVar39,uVar42,uVar49,4,opt->blob_allocator);
          unaff_EBP = -100;
          pPVar76 = this;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)uVar42 < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar69 = (ulong)uVar39;
              uVar49 = 0;
              do {
                p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                  auVar72._4_4_ = uVar2;
                  auVar72._0_4_ = uVar2;
                  auVar72._8_4_ = uVar2;
                  auVar72._12_4_ = uVar2;
                }
                else {
                  auVar72 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar49 * 0x10);
                }
                uVar75 = in_XMM1_Qa;
                if (0 < (int)uVar39) {
                  uVar63 = 0;
                  do {
                    sVar51 = top_blob->elemsize;
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    sVar60 = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar63 * sVar51 * sVar60 + top_blob->cstep * uVar49 * sVar51);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar51;
                    m.elemsize._4_4_ = (undefined4)(sVar51 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    uVar42 = (int)uVar63 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
                    if ((int)uVar42 < 0 || iVar5 <= (int)uVar42) {
                      m.cstep._0_4_ = (int)sVar60;
                      pauVar48 = (undefined1 (*) [16])m.data;
                      if (0 < (int)m.cstep) {
                        do {
                          *pauVar48 = auVar72;
                          m.cstep._0_4_ = (int)m.cstep + -1;
                          pauVar48 = pauVar48 + 1;
                        } while ((int)m.cstep != 0);
                      }
                    }
                    else {
                      m_1.h = bottom_blob->h;
                      sVar51 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar51 * (ulong)uVar42 +
                                         bottom_blob->cstep * uVar49 * sVar51);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar51;
                      m_1.elemsize._4_4_ = (undefined4)(sVar51 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var6 = this->_vptr_Padding_x86_avx512[-3];
                      v_10._0_8_ = auVar72._0_8_;
                      v_10[2] = (float)(int)in_XMM1_Qa;
                      v_10[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                      m.cstep = sVar60;
                      padding_constant_pack4_sse
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var6),
                                 *(int *)(&this->field_0xd4 + (long)p_Var6),
                                 *(int *)(&this->field_0xd8 + (long)p_Var6),
                                 *(int *)(&this->field_0xdc + (long)p_Var6),v_10);
                      piVar8 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      this = pPVar76;
                      if (piVar8 != (int *)0x0) {
                        LOCK();
                        *piVar8 = *piVar8 + -1;
                        UNLOCK();
                        if (*piVar8 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                              this = pPVar76;
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                            this = pPVar76;
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      pPVar76 = this;
                      sVar60 = m.cstep;
                    }
                    m.cstep = sVar60;
                    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar8 != (int *)0x0) {
                      LOCK();
                      *piVar8 = *piVar8 + -1;
                      UNLOCK();
                      if (*piVar8 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            this = pPVar76;
                            free(m.data);
                            pPVar76 = this;
                          }
                        }
                        else {
                          this = pPVar76;
                          (*(m.allocator)->_vptr_Allocator[3])();
                          pPVar76 = this;
                        }
                      }
                    }
                    in_XMM1_Qa = 0;
                    uVar75 = 0;
                    uVar63 = uVar63 + 1;
                  } while (uVar63 != uVar69);
                }
                uVar49 = uVar49 + 1;
                in_XMM1_Qa = uVar75;
              } while (uVar49 != uVar43);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar67 == 0) {
          return unaff_EBP;
        }
      }
    }
    piVar8 = bottom_blob->refcount;
    m.data = bottom_blob->data;
    m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
    m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
    m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.dims = bottom_blob->dims;
    m.w = bottom_blob->w;
    uVar10 = bottom_blob->h;
    uVar11 = bottom_blob->d;
    m.c = bottom_blob->c;
    m.cstep = bottom_blob->cstep;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    m.h = uVar10;
    m.d = uVar11;
    if (iVar38 != 1) {
      m_1.data = *(void **)opt;
      uVar12 = opt->openmp_blocktime;
      uVar13 = opt->use_winograd_convolution;
      uVar15 = opt->use_sgemm_convolution;
      uVar17 = opt->use_int8_inference;
      uVar19 = opt->use_vulkan_compute;
      uVar18 = CONCAT11(uVar19,uVar17);
      uVar16 = CONCAT21(uVar18,uVar15);
      uVar14 = CONCAT31(uVar16,uVar13);
      m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
      m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      uVar20 = opt->flush_denormals;
      uVar21 = opt->use_local_pool_allocator;
      uVar23 = opt->use_shader_local_memory;
      uVar25 = opt->use_cooperative_matrix;
      uVar27 = opt->use_winograd23_convolution;
      uVar26 = CONCAT11(uVar27,uVar25);
      uVar24 = CONCAT21(uVar26,uVar23);
      uVar22 = CONCAT31(uVar24,uVar21);
      uVar75._0_1_ = opt->use_winograd43_convolution;
      uVar75._1_1_ = opt->use_winograd63_convolution;
      uVar75._2_1_ = opt->use_reserved_6;
      uVar75._3_1_ = opt->use_reserved_7;
      uVar28 = opt->use_reserved_8;
      uVar29 = opt->use_reserved_9;
      uVar31 = opt->use_reserved_10;
      uVar33 = opt->use_reserved_11;
      uVar32 = CONCAT11(uVar33,uVar31);
      uVar30 = CONCAT21(uVar32,uVar29);
      uVar75._4_4_ = CONCAT31(uVar30,uVar28);
      m_1.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.c = (int)uVar75;
      m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      this = pPVar76;
      m_1.elempack = uVar12;
      m_1._28_4_ = uVar14;
      m_1.h = uVar20;
      m_1.d = uVar22;
      m_1._60_4_ = uVar75._4_4_;
      convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    }
    iVar38 = Padding::forward((Padding *)
                              ((long)&this->_vptr_Padding_x86_avx512 +
                              (long)this->_vptr_Padding_x86_avx512[-3]),&m,top_blob,opt);
    piVar8 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar38;
}

Assistant:

int Padding_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}